

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator_unittests.cc
# Opt level: O3

void __thiscall cpp_mediator_send_receive_Test::TestBody(cpp_mediator_send_receive_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  response_type b_res;
  response_type b_res_1;
  Message local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  int local_10 [2];
  
  local_10[0] = 3;
  local_30.ss_.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>(local_20,"3","b_res",(int *)&local_30,local_10);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_10[0] = 1;
    local_30.ss_.ptr_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>(local_20,"1","a_res",(int *)&local_30,local_10);
    if (local_20[0] == (internal)0x0) {
      testing::Message::Message(&local_30);
      if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
                 ,0x38,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_10[1] = 3;
      local_30.ss_.ptr_._0_4_ = 3;
      testing::internal::CmpHelperEQ<int,int>(local_20,"3","b_res",(int *)&local_30,local_10 + 1);
      if (local_20[0] == (internal)0x0) {
        testing::Message::Message(&local_30);
        if (local_18.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
                   ,0x3a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_28,&local_30);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_10[0] = 2;
        local_30.ss_.ptr_._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,int>(local_20,"2","a_res",(int *)&local_30,local_10);
        if (local_20[0] == (internal)0x0) {
          testing::Message::Message(&local_30);
          if (local_18.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
                     ,0x40,pcVar2);
          testing::internal::AssertHelper::operator=(&local_28,&local_30);
          testing::internal::AssertHelper::~AssertHelper(&local_28);
          if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8))
                        ();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_10[1] = 3;
          local_30.ss_.ptr_._0_4_ = 3;
          testing::internal::CmpHelperEQ<int,int>
                    (local_20,"3","b_res",(int *)&local_30,local_10 + 1);
          if (local_20[0] == (internal)0x0) {
            testing::Message::Message(&local_30);
            if (local_18.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((local_18.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_28,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/nolanholden[P]cpp-mediator/tests/mediator_unittests.cc"
                       ,0x42,pcVar2);
            testing::internal::AssertHelper::operator=(&local_28,&local_30);
            testing::internal::AssertHelper::~AssertHelper(&local_28);
            if (CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != 0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,local_30.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
    }
  }
  return;
}

Assistant:

TEST(cpp_mediator, send_receive) {
  AHandler1 a1{};
  AHandler2 a2{};
  BHandler b{};

  // None of these should compile!:
  // 
  // auto m = holden::make_mediator(); // error: no handler for `GetA` exists
  // m.send(GetA{});
  // 
  // auto m = holden::make_mediator(b); // error: no handler for `GetA` exists
  // m.send(GetA{});
  // 
  // auto m = holden::make_mediator(a1, a2, b); // error: more than one handler 
  // m.send(GetA{});                            //  for a given request
  // 
  // auto m = holden::make_mediator(a1, a1, b); // error: more than one handler 
  // m.send(GetA{});                            //  for a given request
  // 

  {
    auto m = holden::make_mediator(b);
    auto b_res = m.send(GetB{});
    ASSERT_EQ(3, b_res);
  }

  {
    auto m = holden::make_mediator(a1, b);
    auto a_res =  m.send(GetA{});
    ASSERT_EQ(1, a_res);
    auto b_res = m.send(GetB{});
    ASSERT_EQ(3, b_res);
  }

  {
    auto m = holden::make_mediator(a2, b);
    auto a_res =  m.send(GetA{});
    ASSERT_EQ(2, a_res);
    auto b_res = m.send(GetB{});
    ASSERT_EQ(3, b_res);
  }
}